

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::CtrlInst::display(CtrlInst *this,ostream *o)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  type_info *this_00;
  char *pcVar5;
  ostream *in_RSI;
  long in_RDI;
  float fVar6;
  double dVar7;
  any *in_stack_ffffffffffffff30;
  string *psVar8;
  any *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  string local_60 [48];
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 0xd) & 1) == 0) {
    poVar3 = std::operator<<(in_RSI,"@ ");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x10));
    poVar3 = std::operator<<(poVar3,"<");
    this_00 = std::any::type(in_stack_ffffffffffffff38);
    pcVar5 = std::type_info::name(this_00);
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::operator<<(poVar3,">");
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    if (bVar1) {
      poVar3 = std::operator<<(local_10,"(value=");
      iVar2 = std::any_cast<int>(in_stack_ffffffffffffff30);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::operator<<(poVar3,")");
    }
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    if (bVar1) {
      poVar3 = std::operator<<(local_10,"(value=");
      dVar7 = std::any_cast<double>(in_stack_ffffffffffffff30);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
      std::operator<<(poVar3,")");
    }
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    if (bVar1) {
      poVar3 = std::operator<<(local_10,"(value=");
      fVar6 = std::any_cast<float>(in_stack_ffffffffffffff30);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar6);
      std::operator<<(poVar3,")");
    }
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    if (bVar1) {
      in_stack_ffffffffffffff40 = std::operator<<(local_10,"(value=");
      lVar4 = std::any_cast<long>(in_stack_ffffffffffffff30);
      poVar3 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff40,lVar4);
      std::operator<<(poVar3,")");
    }
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    if (bVar1) {
      poVar3 = std::operator<<(local_10,"(value=");
      psVar8 = local_60;
      std::any_cast<std::__cxx11::string>(in_stack_ffffffffffffff38);
      poVar3 = std::operator<<(poVar3,psVar8);
      std::operator<<(poVar3,")");
      std::__cxx11::string::~string(local_60);
    }
  }
  else {
    poVar3 = std::operator<<(in_RSI,".");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x10));
    std::operator<<(poVar3," ");
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    poVar3 = local_10;
    if (bVar1) {
      iVar2 = std::any_cast<int>(in_stack_ffffffffffffff30);
      std::ostream::operator<<(poVar3,iVar2);
    }
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    poVar3 = local_10;
    if (bVar1) {
      dVar7 = std::any_cast<double>(in_stack_ffffffffffffff30);
      std::ostream::operator<<(poVar3,dVar7);
    }
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    poVar3 = local_10;
    if (bVar1) {
      fVar6 = std::any_cast<float>(in_stack_ffffffffffffff30);
      std::ostream::operator<<(poVar3,fVar6);
    }
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    poVar3 = local_10;
    if (bVar1) {
      lVar4 = std::any_cast<long>(in_stack_ffffffffffffff30);
      std::ostream::operator<<(poVar3,lVar4);
    }
    std::any::type(in_stack_ffffffffffffff38);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff40,(type_info *)in_stack_ffffffffffffff38
                      );
    if (bVar1) {
      std::any_cast<std::__cxx11::string>(in_stack_ffffffffffffff38);
      std::operator<<(local_10,local_30);
      std::__cxx11::string::~string(local_30);
    }
  }
  return;
}

Assistant:

void CtrlInst::display(std::ostream &o) const {
  if (is_asm_option) {
    o << "." << key << " ";
    ctrl_inst_display_type_a(val, int);
    ctrl_inst_display_type_a(val, double);
    ctrl_inst_display_type_a(val, float);
    ctrl_inst_display_type_a(val, long);
    ctrl_inst_display_type_a(val, std::string);
  } else {
    o << "@ " << key << "<" << val.type().name() << ">";
    ctrl_inst_display_type(val, int);
    ctrl_inst_display_type(val, double);
    ctrl_inst_display_type(val, float);
    ctrl_inst_display_type(val, long);
    ctrl_inst_display_type(val, std::string);
  }
}